

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_tools.h
# Opt level: O0

void __thiscall
ncnn::SafeOrderList<ncnn::ObjectBox>::insert(SafeOrderList<ncnn::ObjectBox> *this,ObjectBox *value)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RSI;
  value_type *in_RDI;
  Iterator iter;
  MutexLockGuard guard;
  Mutex *in_stack_ffffffffffffff88;
  MutexLockGuard *in_stack_ffffffffffffff90;
  undefined8 uVar4;
  list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *in_stack_ffffffffffffffb0;
  const_iterator in_stack_ffffffffffffffb8;
  _Self local_28;
  _Self local_20 [2];
  undefined8 local_10;
  
  local_10 = in_RSI;
  MutexLockGuard::MutexLockGuard(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_20[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::begin
                 ((list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)
                  in_stack_ffffffffffffff88);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::end
                   ((list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)
                    in_stack_ffffffffffffff88);
    bVar2 = std::operator!=(local_20,&local_28);
    if (!bVar2) break;
    pcVar1 = *(code **)(in_RDI + 1);
    uVar4 = local_10;
    std::_List_iterator<ncnn::ObjectBox>::operator*((_List_iterator<ncnn::ObjectBox> *)0x1cf39b);
    iVar3 = (*pcVar1)(uVar4);
    if (0 < iVar3) break;
    std::_List_iterator<ncnn::ObjectBox>::operator++(local_20,0);
  }
  std::_List_const_iterator<ncnn::ObjectBox>::_List_const_iterator
            ((_List_const_iterator<ncnn::ObjectBox> *)&stack0xffffffffffffffb8,local_20);
  std::__cxx11::list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::insert
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_RDI);
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x1cf429);
  return;
}

Assistant:

void insert(const T &value)
  {
    MutexLockGuard guard(mutex);
    Iterator iter = container.begin();
    for (; iter != container.end(); iter++)
    {
      if (condition(value, *iter) > 0)
        break;
    }
    container.insert(iter, value);
  }